

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O1

int __thiscall deqp::egl::FenceSyncTests::init(FenceSyncTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestCaseGroup *pTVar1;
  SyncTest *pSVar2;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"valid","Valid function calls");
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "create_null_attribs","create_null_attribs");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215fae8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "create_empty_attribs","create_empty_attribs");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215fb88;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "wait_no_timeout","wait_no_timeout");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215fbd8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "wait_forever","wait_forever");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215fc28;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "wait_no_context","wait_no_Context");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215fc78;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "wait_forever_flush","wait_forever_flush");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215fcc8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,"get_type",
             "get_type");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215fd18;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,"get_status"
             ,"get_status");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215fd68;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "get_status_signaled","get_status_signaled");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215fdb8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "get_condition","get_condition");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215fe08;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,"destroy",
             "destroy");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215fe58;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_WAIT_SYNC,true,
             "wait_server","wait_server");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215fea8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,"invalid","Invalid function calls");
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "create_invalid_display","create_invalid_display");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215fef8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "create_invalid_type","create_invalid_type");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215ff48;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "create_invalid_attribs","create_invalid_attribs");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215ff98;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "create_invalid_context","create_invalid_context");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_0215ffe8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "wait_invalid_display","wait_invalid_display");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02160038;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "wait_invalid_sync","wait_invalid_sync");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02160088;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "get_invalid_display","get_invalid_display");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_021600d8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "get_invalid_sync","get_invalid_sync");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02160128;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "get_invalid_attribute","get_invalid_attribute");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02160178;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "get_invalid_value","get_invalid_value");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_021601c8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "destroy_invalid_display","destroy_invalid_display");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02160218;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_NONE,true,
             "destroy_invalid_sync","destroy_invalid_sync");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02160268;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_WAIT_SYNC,true,
             "wait_server_invalid_display","wait_server_invalid_display");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_021602b8;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_WAIT_SYNC,true,
             "wait_server_invalid_sync","wait_server_invalid_sync");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02160308;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  pSVar2 = (SyncTest *)operator_new(0x1ae0);
  egl::anon_unknown_0::SyncTest::SyncTest
            (pSVar2,(this->super_TestCaseGroup).m_eglTestCtx,0x30f9,EXTENSION_WAIT_SYNC,true,
             "wait_server_invalid_flag","wait_server_invalid_flag");
  (pSVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SyncTest_02160358;
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pSVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void FenceSyncTests::init (void)
{
	// Add valid API test
	{
		TestCaseGroup* const valid = new TestCaseGroup(m_eglTestCtx, "valid", "Valid function calls");

		// eglCreateSyncKHR tests
		valid->addChild(new CreateNullAttribsTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		valid->addChild(new CreateEmptyAttribsTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));

		// eglClientWaitSyncKHR tests
		valid->addChild(new ClientWaitNoTimeoutTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		valid->addChild(new ClientWaitForeverTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		valid->addChild(new ClientWaitNoContextTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		valid->addChild(new ClientWaitForeverFlushTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));

		// eglGetSyncAttribKHR tests
		valid->addChild(new GetSyncTypeTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		valid->addChild(new GetSyncStatusTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		valid->addChild(new GetSyncStatusSignaledTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		valid->addChild(new GetSyncConditionTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));

		// eglDestroySyncKHR tests
		valid->addChild(new DestroySyncTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));

		// eglWaitSyncKHR tests
		valid->addChild(new WaitSyncTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));

		addChild(valid);
	}

	// Add negative API tests
	{
		TestCaseGroup* const invalid = new TestCaseGroup(m_eglTestCtx, "invalid", "Invalid function calls");

		// eglCreateSyncKHR tests
		invalid->addChild(new CreateInvalidDisplayTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		invalid->addChild(new CreateInvalidTypeTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		invalid->addChild(new CreateInvalidAttribsTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		invalid->addChild(new CreateInvalidContextTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));

		// eglClientWaitSyncKHR tests
		invalid->addChild(new ClientWaitInvalidDisplayTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		invalid->addChild(new ClientWaitInvalidSyncTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));

		// eglGetSyncAttribKHR tests
		invalid->addChild(new GetSyncInvalidDisplayTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		invalid->addChild(new GetSyncInvalidSyncTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		invalid->addChild(new GetSyncInvalidAttributeTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		invalid->addChild(new GetSyncInvalidValueTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));

		// eglDestroySyncKHR tests
		invalid->addChild(new DestroySyncInvalidDislayTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		invalid->addChild(new DestroySyncInvalidSyncTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));

		// eglWaitSyncKHR tests
		invalid->addChild(new WaitSyncInvalidDisplayTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		invalid->addChild(new WaitSyncInvalidSyncTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));
		invalid->addChild(new WaitSyncInvalidFlagTest(m_eglTestCtx, EGL_SYNC_FENCE_KHR));

		addChild(invalid);
	}
}